

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io.cpp
# Opt level: O2

void lume::ParseElementIndicesToArrayAnnex<unsigned_int>
               (SPMesh *mesh,string *annexName,xml_node<char> *node,uint value,GrobSet *gs)

{
  Mesh *mesh_00;
  index_t ind;
  char *pcVar1;
  value_type_conflict3 *pvVar2;
  LumeError *this;
  char *__s;
  initializer_list<lume::grob_t> __l;
  size_type sStack_130;
  allocator_type local_119;
  GrobIndex ig;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_100;
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_> annexTable;
  TotalToGrobIndexMap indMap;
  
  if (node == (xml_node<char> *)0x0) {
    return;
  }
  if (3 < *(uint *)(impl::GROB_SET_DESCS + (ulong)(gs->m_offset + 1) * 4)) {
    this = (LumeError *)__cxa_allocate_exception(0x30);
    LumeError::LumeError(this,"UGXGrobTypeArrayFromGrobSet: Unsupported grob set dimension");
    __cxa_throw(this,&LumeError::typeinfo,LumeError::~LumeError);
  }
  mesh_00 = (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch(*(uint *)(impl::GROB_SET_DESCS + (ulong)(gs->m_offset + 1) * 4)) {
  case 0:
    ig = (GrobIndex)((ulong)ig.index << 0x20);
    break;
  case 1:
    ig.grobType = EDGE;
    break;
  case 2:
    ig.grobType = TRI;
    ig.index = 3;
    sStack_130 = 2;
    goto LAB_0019b310;
  case 3:
    ig.grobType = TET;
    ig.index = 5;
    sStack_130 = 4;
    goto LAB_0019b310;
  }
  sStack_130 = 1;
LAB_0019b310:
  __l._M_array = &ig;
  __l._M_len = sStack_130;
  std::vector<lume::grob_t,_std::allocator<lume::grob_t>_>::vector
            ((vector<lume::grob_t,_std::allocator<lume::grob_t>_> *)&annexTable,__l,&local_119);
  TotalToGrobIndexMap::TotalToGrobIndexMap
            (&indMap,mesh_00,(vector<lume::grob_t,_std::allocator<lume::grob_t>_> *)&annexTable);
  std::_Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_>::~_Vector_base
            ((_Vector_base<lume::grob_t,_std::allocator<lume::grob_t>_> *)&annexTable);
  std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,&mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::ArrayAnnexTable
            (&annexTable,(SPMesh *)&local_100,annexName,(GrobSet)gs->m_offset,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::resize_annexes_to_match_grobs(&annexTable,1);
  pcVar1 = (node->super_xml_base<char>).m_value;
  __s = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  pcVar1 = strtok(__s," ");
  while (pcVar1 != (char *)0x0) {
    ind = atoi(pcVar1);
    ig = TotalToGrobIndexMap::operator()(&indMap,ind);
    pvVar2 = ArrayAnnexTable<lume::ArrayAnnex<unsigned_int>_>::operator[](&annexTable,&ig);
    *pvVar2 = value;
    pcVar1 = strtok((char *)0x0," ");
  }
  AnnexTable<lume::ArrayAnnex<unsigned_int>_>::~AnnexTable(&annexTable.m_annexTable);
  TotalToGrobIndexMap::~TotalToGrobIndexMap(&indMap);
  return;
}

Assistant:

static void ParseElementIndicesToArrayAnnex (SPMesh& mesh,
                                            const string& annexName,
                                            xml_node<>* node,
                                            const T value,
                                            const GrobSet& gs)
{
	if (!node) return;
	
	// indices in the node are referring to all elements of one dimension.
	// we have to map them to indices of individual grob types.
	TotalToGrobIndexMap indMap (*mesh, UGXGrobTypeArrayFromGrobSet (gs));

	ArrayAnnexTable <ArrayAnnex<T>> annexTable (mesh, annexName, gs, true);
	annexTable.resize_annexes_to_match_grobs (1);

	// parse the node values and assign indices
	char* p = strtok (node->value(), " ");
	while (p) {
		const auto ig = indMap (index_t (atoi(p)));
		annexTable [ig] = value;
		p = strtok (nullptr, " ");
	}
}